

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14b2df::Utf8Test_Proto2StringValidates_Test::~Utf8Test_Proto2StringValidates_Test
          (Utf8Test_Proto2StringValidates_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Utf8Test, Proto2StringValidates) {
  upb::Arena arena;
  size_t size;
  char* data = GetBadUtf8Payload(arena.ptr(), &size);

  upb_test_TestUtf8Proto2String* msg =
      upb_test_TestUtf8Proto2String_new(arena.ptr());

  upb_DecodeStatus status;
  status = upb_Decode(data, size, UPB_UPCAST(msg),
                      &upb_0test__TestUtf8Proto2String_msg_init, nullptr, 0,
                      arena.ptr());

  // Parse succeeds, because proto2 string fields don't validate UTF-8.
  ASSERT_EQ(kUpb_DecodeStatus_Ok, status);
}